

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enummanager.cpp
# Opt level: O0

Enum * __thiscall camp::detail::EnumManager::getByIndex(EnumManager *this,size_t index)

{
  size_t index_00;
  size_type sVar1;
  OutOfRange *__return_storage_ptr__;
  EnumInfo *pEVar2;
  element_type *peVar3;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_>
  local_c8;
  const_iterator it;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  OutOfRange local_60;
  size_t local_18;
  size_t index_local;
  EnumManager *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  sVar1 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>,_boost::mpl::v_item<camp::detail::EnumManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::size(&(this->m_enums).super_type.super_type);
  if (sVar1 <= index) {
    it.node._6_1_ = 1;
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    index_00 = local_18;
    sVar1 = boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>,_boost::mpl::v_item<camp::detail::EnumManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
            ::size(&(this->m_enums).super_type.super_type);
    OutOfRange::OutOfRange(&local_60,index_00,sVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enummanager.cpp"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"const Enum &camp::detail::EnumManager::getByIndex(std::size_t) const",
               (allocator *)((long)&it.node + 7));
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr__,&local_60,(string *)local_90,0x55,(string *)local_b8);
    it.node._6_1_ = 0;
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,OutOfRange::~OutOfRange);
  }
  local_c8.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>,_boost::mpl::v_item<camp::detail::EnumManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::begin(&(this->m_enums).super_type.super_type);
  std::
  advance<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,std::allocator<camp::detail::EnumManager::EnumInfo>>>>>,unsigned_long>
            (&local_c8,local_18);
  pEVar2 = boost::operators_impl::
           dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_>,_const_camp::detail::EnumManager::EnumInfo_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_camp::detail::EnumManager::EnumInfo,_long,_const_camp::detail::EnumManager::EnumInfo_*,_const_camp::detail::EnumManager::EnumInfo_&>_>_>
           ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_>,_const_camp::detail::EnumManager::EnumInfo_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_camp::detail::EnumManager::EnumInfo,_long,_const_camp::detail::EnumManager::EnumInfo_*,_const_camp::detail::EnumManager::EnumInfo_&>_>_>
                         *)&local_c8);
  peVar3 = std::__shared_ptr_access<camp::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<camp::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pEVar2->enumPtr);
  return peVar3;
}

Assistant:

const Enum& EnumManager::getByIndex(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_enums.size())
        CAMP_ERROR(OutOfRange(index, m_enums.size()));

    EnumTable::const_iterator it = m_enums.begin();
    std::advance(it, index);

    return *it->enumPtr;
}